

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O2

void __thiscall
array<CEditorImage_*,_allocator_default<CEditorImage_*>_>::remove_index
          (array<CEditorImage_*,_allocator_default<CEditorImage_*>_> *this,int index)

{
  int iVar1;
  long lVar2;
  long lVar3;
  
  iVar1 = this->num_elements;
  lVar3 = (long)index;
  while (lVar2 = lVar3 + 1, lVar2 < iVar1) {
    this->list[lVar3] = this->list[lVar2];
    lVar3 = lVar2;
  }
  set_size(this,iVar1 + -1);
  return;
}

Assistant:

void remove_index(int index)
	{
		for(int i = index+1; i < num_elements; i++)
			list[i-1] = list[i];

		set_size(size()-1);
	}